

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int __thiscall QObject::senderSignalIndex(QObject *this)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  int iVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QMetaMethod local_38;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)local_28,
             (QBasicMutex *)
             ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
             ((ulong)this & 0xffffffff) % 0x418));
  pQVar2 = pQVar1[1].parent;
  iVar3 = -1;
  if ((pQVar2 != (QObject *)0x0) && (pQVar1 = pQVar2[1].d_ptr.d, pQVar1 != (QObjectData *)0x0)) {
    pQVar4 = pQVar2 + 1;
    do {
      pQVar4 = (QObject *)pQVar4->_vptr_QObject;
      if (pQVar4 == (QObject *)0x0) goto LAB_0028adc3;
    } while ((QObject *)pQVar4[2]._vptr_QObject != pQVar1->parent);
    iVar3 = (**((QObject *)pQVar4[2]._vptr_QObject)->_vptr_QObject)();
    local_38.mobj =
         (QMetaObject *)
         QMetaObjectPrivate::signal
                   (iVar3,(__sighandler_t)(ulong)*(uint *)&((pQVar2[1].d_ptr.d)->children).d.d);
    iVar3 = QMetaMethod::methodIndex(&local_38);
  }
LAB_0028adc3:
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::senderSignalIndex() const
{
    Q_D(const QObject);

    QMutexLocker locker(signalSlotLock(this));
    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (!cd || !cd->currentSender)
        return -1;

    for (QObjectPrivate::Connection *c = cd->senders; c; c = c->next) {
        if (c->sender == cd->currentSender->sender) {
            // Convert from signal range to method range
            return QMetaObjectPrivate::signal(c->sender->metaObject(), cd->currentSender->signal).methodIndex();
        }
    }

    return -1;
}